

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

void __thiscall Parser::StringLiteral(Parser *this,ASTNode **node)

{
  Symbol *this_00;
  Symbol *sym;
  ASTNode **node_local;
  Parser *this_local;
  
  this_00 = Semantics::NewSymbol(&this->semantics,node);
  std::__cxx11::string::operator=((string *)this_00,(string *)(*node)->token);
  this_00->datatype = string;
  this_00->kind = literal;
  return;
}

Assistant:

void Parser::StringLiteral(ASTNode*& node)
{
	Symbol* sym = semantics.NewSymbol(node);
	sym->id = node->token->payload;
	sym->datatype = SymbolDataType::string;
	sym->kind = SymbolKind::literal; // literals are temporarly stored on the stack(with no particular reference).
	//semantics.AddSymbol(sym);
}